

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O1

olsrv2_tc_edge * olsrv2_tc_edge_add(olsrv2_tc_node *src,netaddr *addr)

{
  avl_node *paVar1;
  long lVar2;
  olsrv2_tc_edge *ptr;
  olsrv2_tc_edge *poVar3;
  olsrv2_tc_node *poVar4;
  
  paVar1 = avl_find(&src->_edges,addr);
  ptr = (olsrv2_tc_edge *)&paVar1[-1].list.prev;
  if (paVar1 == (avl_node *)0x0) {
    ptr = (olsrv2_tc_edge *)oonf_class_malloc(&_tc_edge_class);
    if (ptr != (olsrv2_tc_edge *)0x0) {
      poVar3 = (olsrv2_tc_edge *)oonf_class_malloc(&_tc_edge_class);
      if (poVar3 != (olsrv2_tc_edge *)0x0) {
        paVar1 = avl_find(&_tc_tree,addr);
        poVar4 = (olsrv2_tc_node *)(paVar1 + -6);
        if ((paVar1 != (avl_node *)0x0) ||
           (poVar4 = olsrv2_tc_node_add(addr,0,0), poVar4 != (olsrv2_tc_node *)0x0)) {
          ptr->src = src;
          ptr->dst = poVar4;
          ptr->inverse = poVar3;
          lVar2 = 6;
          do {
            ptr->cost[lVar2 + -6] = 0xffffff;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 10);
          (ptr->_node).key = poVar4;
          avl_insert(&src->_edges,&ptr->_node);
          poVar3->src = poVar4;
          poVar3->dst = src;
          poVar3->inverse = ptr;
          poVar3->virtual = true;
          lVar2 = 0;
          do {
            poVar3->cost[lVar2] = 0xffffff;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          (poVar3->_node).key = src;
          avl_insert(&poVar4->_edges,&poVar3->_node);
          goto LAB_001356b8;
        }
        oonf_class_free(&_tc_edge_class,ptr);
        ptr = poVar3;
      }
      oonf_class_free(&_tc_edge_class,ptr);
    }
    ptr = (olsrv2_tc_edge *)0x0;
  }
  else {
    paVar1[-1].field_0x32 = 0;
    lVar2 = 6;
    do {
      *(undefined4 *)((long)ptr + (lVar2 + -6) * 4 + 0x18) = 0xffffff;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
LAB_001356b8:
    oonf_class_event(&_tc_edge_class,ptr,OONF_OBJECT_ADDED);
  }
  return ptr;
}

Assistant:

struct olsrv2_tc_edge *
olsrv2_tc_edge_add(struct olsrv2_tc_node *src, struct netaddr *addr) {
  struct olsrv2_tc_edge *edge = NULL, *inverse = NULL;
  struct olsrv2_tc_node *dst = NULL;
  int i;

  edge = avl_find_element(&src->_edges, addr, edge, _node);
  if (edge != NULL) {
    edge->virtual = false;

    /* cleanup metric data from other side of the edge */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      edge->cost[i] = RFC7181_METRIC_INFINITE;
    }

    /* fire event */
    oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
    return edge;
  }

  /* allocate edge */
  edge = oonf_class_malloc(&_tc_edge_class);
  if (edge == NULL) {
    return NULL;
  }

  /* allocate inverse edge */
  inverse = oonf_class_malloc(&_tc_edge_class);
  if (inverse == NULL) {
    oonf_class_free(&_tc_edge_class, edge);
    return NULL;
  }

  /* find or allocate destination node */
  dst = avl_find_element(&_tc_tree, addr, dst, _originator_node);
  if (dst == NULL) {
    /* create virtual node */
    dst = olsrv2_tc_node_add(addr, 0, 0);
    if (dst == NULL) {
      oonf_class_free(&_tc_edge_class, edge);
      oonf_class_free(&_tc_edge_class, inverse);
      return NULL;
    }
  }

  /* initialize edge */
  edge->src = src;
  edge->dst = dst;
  edge->inverse = inverse;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    edge->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook edge into src node */
  edge->_node.key = &dst->target.prefix.dst;
  avl_insert(&src->_edges, &edge->_node);

  /* initialize inverse (virtual) edge */
  inverse->src = dst;
  inverse->dst = src;
  inverse->inverse = edge;
  inverse->virtual = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    inverse->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook inverse edge into dst node */
  inverse->_node.key = &src->target.prefix.dst;
  avl_insert(&dst->_edges, &inverse->_node);

  /* fire event */
  oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
  return edge;
}